

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O0

void hdr_base64_decode_block(char *input,uint8_t *output)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t _24_bit_value;
  uint8_t *output_local;
  char *input_local;
  
  iVar1 = from_base_64((int)*input);
  iVar2 = from_base_64((int)input[1]);
  iVar3 = from_base_64((int)input[2]);
  uVar4 = from_base_64((int)input[3]);
  uVar4 = uVar4 | iVar3 << 6 | iVar2 << 0xc | iVar1 << 0x12;
  *output = (uint8_t)(uVar4 >> 0x10);
  output[1] = (uint8_t)(uVar4 >> 8);
  output[2] = (uint8_t)uVar4;
  return;
}

Assistant:

void hdr_base64_decode_block(const char* input, uint8_t* output)
{
    uint32_t _24_bit_value = 0;

    _24_bit_value |= from_base_64(input[0]) << 18;
    _24_bit_value |= from_base_64(input[1]) << 12;
    _24_bit_value |= from_base_64(input[2]) << 6;
    _24_bit_value |= from_base_64(input[3]);

    output[0] = (uint8_t) ((_24_bit_value >> 16) & 0xFF);
    output[1] = (uint8_t) ((_24_bit_value >> 8) & 0xFF);
    output[2] = (uint8_t) ((_24_bit_value) & 0xFF);
}